

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O3

int i2d_RSAPrivateKey(RSA *a,uchar **out)

{
  int iVar1;
  CBB cbb;
  CBB local_40;
  
  iVar1 = CBB_init(&local_40,0);
  if ((iVar1 != 0) && (iVar1 = RSA_marshal_private_key(&local_40,(RSA *)a), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d(&local_40,out);
    return iVar1;
  }
  CBB_cleanup(&local_40);
  return -1;
}

Assistant:

int i2d_RSAPrivateKey(const RSA *in, uint8_t **outp) {
  CBB cbb;
  if (!CBB_init(&cbb, 0) ||
      !RSA_marshal_private_key(&cbb, in)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}